

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall
QTreeViewPrivate::layout
          (QTreeViewPrivate *this,int i,bool recursiveExpanding,bool afterIsUninitialized)

{
  QList<QTreeViewItem> *this_00;
  QObject *this_01;
  QTreeViewItem *pQVar1;
  long lVar2;
  QAbstractItemModel *pQVar3;
  long lVar4;
  QWidgetData *pQVar5;
  Data *pDVar6;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_> *pDVar7
  ;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *pDVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  pointer pQVar14;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar15;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  bool bVar24;
  bool bVar25;
  Bucket BVar26;
  QModelIndex ret;
  ulong local_e0;
  QPersistentModelIndex local_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a8;
  undefined1 *local_98;
  QModelIndex *pQStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QPersistentModelIndex local_78;
  QPersistentModelIndex local_70;
  undefined1 *local_68;
  QModelIndex *pQStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  int local_50;
  undefined8 local_4c;
  long local_38;
  
  uVar20 = (ulong)(uint)i;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QObject **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_98 = (undefined1 *)0xffffffffffffffff;
  pQStack_90 = (QModelIndex *)0x0;
  local_88.ptr = (QAbstractItemModel *)0x0;
  local_a8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  uVar17 = (ulong)(uint)i;
  if (i < 0) {
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_b8,&(this->super_QAbstractItemViewPrivate).root);
  }
  else if (uVar17 < (ulong)(this->viewItems).d.size) {
    pQVar1 = (this->viewItems).d.ptr;
    local_a8.ptr = pQVar1[uVar17].index.m.ptr;
    pQVar1 = pQVar1 + uVar17;
    local_b8 = *(undefined1 **)&pQVar1->index;
    puStack_b0 = (undefined1 *)(pQVar1->index).i;
  }
  else {
    local_b8 = (undefined1 *)0xffffffffffffffff;
    puStack_b0 = (undefined1 *)0x0;
    local_a8.ptr = (QAbstractItemModel *)0x0;
  }
  if ((i < 0) ||
     (((-1 < (int)local_b8 && (-1 < (long)local_b8)) && (local_a8.ptr != (QAbstractItemModel *)0x0))
     )) {
    lVar2 = (this->viewItems).d.size;
    pQVar3 = (this->super_QAbstractItemViewPrivate).model;
    cVar10 = (**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,&local_b8);
    uVar16 = 0;
    if (cVar10 != '\0') {
      pQVar3 = (this->super_QAbstractItemViewPrivate).model;
      cVar10 = (**(code **)(*(long *)pQVar3 + 0x130))(pQVar3,&local_b8);
      pQVar3 = (this->super_QAbstractItemViewPrivate).model;
      lVar4 = *(long *)pQVar3;
      if (cVar10 == '\0') {
        uVar13 = (**(code **)(lVar4 + 0x78))(pQVar3,&local_b8);
        uVar16 = (ulong)uVar13;
      }
      else {
        (**(code **)(lVar4 + 0x128))();
        iVar11 = this->defaultItemHeight;
        uVar16 = extraout_RDX;
        if (iVar11 < 1) {
          iVar11 = (**(code **)(*(long *)this_01 + 0x1f8))(this_01,0);
          uVar16 = extraout_RDX_00;
        }
        if (iVar11 == 0) {
          iVar18 = 0;
        }
        else {
          pQVar5 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport
                   )->data;
          iVar12 = ((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1;
          iVar18 = iVar12 / iVar11;
          uVar16 = (long)iVar12 % (long)iVar11 & 0xffffffff;
        }
        pQVar3 = (this->super_QAbstractItemViewPrivate).model;
        uVar13 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_b8,uVar16);
        uVar23 = (ulong)uVar13;
        uVar16 = uVar23;
        if (uVar13 != 0xffffffff && (int)uVar13 < iVar18) {
          while (pQVar3 = (this->super_QAbstractItemViewPrivate).model,
                cVar10 = (**(code **)(*(long *)pQVar3 + 0x130))(pQVar3,&local_b8), uVar16 = uVar23,
                cVar10 != '\0') {
            pQVar3 = (this->super_QAbstractItemViewPrivate).model;
            (**(code **)(*(long *)pQVar3 + 0x128))(pQVar3,&local_b8);
            pQVar3 = (this->super_QAbstractItemViewPrivate).model;
            uVar13 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_b8);
            uVar16 = (ulong)uVar13;
            if ((iVar18 <= (int)uVar13) ||
               (uVar22 = (uint)uVar23, uVar23 = (ulong)uVar13, uVar13 == uVar22)) break;
          }
        }
      }
    }
    this_00 = &this->viewItems;
    uVar13 = (uint)uVar16;
    if (i == -1) {
      if (this->uniformRowHeights == true) {
        local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_60 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar3 = (this->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar3 + 0x60))((QModelIndex *)&local_68,pQVar3,0,0,&local_b8);
        iVar11 = QTreeView::indexRowSizeHint((QTreeView *)this_01,(QModelIndex *)&local_68);
        this->defaultItemHeight = iVar11;
      }
      QList<QTreeViewItem>::resize(this_00,(long)(int)uVar13);
      bVar9 = true;
      afterIsUninitialized = true;
    }
    else {
      pQVar14 = QList<QTreeViewItem>::data(this_00);
      if (*(uint *)&pQVar14[i].field_0x1c >> 4 == uVar13) {
        bVar9 = false;
      }
      else if (afterIsUninitialized) {
        bVar9 = true;
        if (0 < (int)uVar13) {
          QList<QTreeViewItem>::resize(this_00,uVar16 + (this->viewItems).d.size);
        }
      }
      else {
        local_68 = (undefined1 *)0xffffffffffffffff;
        pQStack_60 = (QModelIndex *)0x0;
        local_58.ptr = (QAbstractItemModel *)0x0;
        local_50 = -1;
        local_4c = 0;
        insertViewItems(this,i + 1,uVar13,(QTreeViewItem *)&local_68);
        bVar9 = true;
      }
    }
    uVar22 = 0;
    if (i < 0) {
      local_e0 = 0;
    }
    else {
      local_e0 = *(long *)&(this->viewItems).d.ptr[uVar17].field_0x1c + 0x100000000U &
                 0xffff00000000;
    }
    if ((int)uVar13 < 1) {
      iVar11 = 1;
    }
    else {
      iVar19 = i + 1;
      iVar12 = uVar13 + iVar19;
      iVar21 = 0;
      pQVar14 = (pointer)0x0;
      iVar18 = 0;
      uVar22 = 0;
      do {
        pQVar3 = (this->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar3 + 0x60))(&local_68,pQVar3,iVar21,0,&local_b8);
        local_88.ptr = local_58.ptr;
        local_98 = local_68;
        pQStack_90 = pQStack_60;
        pDVar6 = (this->hiddenIndexes).q_hash.d;
        if ((pDVar6 == (Data *)0x0) || (pDVar6->size == 0)) {
LAB_005b08f5:
          if (pQVar14 != (pointer)0x0) {
            pQVar14->field_0x1c = pQVar14->field_0x1c | 8;
          }
          iVar11 = (iVar18 - uVar22) + iVar19;
          pQVar14 = QList<QTreeViewItem>::data(this_00);
          pQVar14 = pQVar14 + iVar11;
          *(undefined1 **)&pQVar14->index = local_98;
          (pQVar14->index).i = (quintptr)pQStack_90;
          (pQVar14->index).m.ptr = local_88.ptr;
          pQVar14->parentItem = i;
          *(ulong *)&pQVar14->field_0x1c = *(uint *)&pQVar14->field_0x1c | local_e0;
          bVar24 = QTreeView::isFirstColumnSpanned
                             ((QTreeView *)this_01,(int)local_98,(QModelIndex *)&local_b8);
          *(ulong *)&pQVar14->field_0x1c =
               (*(ulong *)&pQVar14->field_0x1c & 0xffffffff00000004) + (ulong)bVar24 * 2;
          if ((!recursiveExpanding) ||
             ((local_88.ptr != (QAbstractItemModel *)0x0 &&
              (cVar10 = (**(code **)(*(long *)local_88.ptr + 0x138))(local_88.ptr,&local_98),
              cVar10 < '\0')))) {
            if ((local_88.ptr == (QAbstractItemModel *)0x0) ||
               (cVar10 = (**(code **)(*(long *)local_88.ptr + 0x138))(local_88.ptr,&local_98),
               -1 < cVar10)) {
              local_58.ptr = local_88.ptr;
              local_68 = local_98;
              pQStack_60 = pQStack_90;
              pDVar7 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                         **)(*(long *)((this->super_QAbstractItemViewPrivate).model + 8) + 0x90);
              if (pDVar7 == (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                             *)0x0) goto LAB_005b0a68;
              BVar26 = QHashPrivate::
                       Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                       ::findBucket<QtPrivate::QModelIndexWrapper>
                                 (pDVar7,(QModelIndexWrapper *)&local_68);
              if ((BVar26.span[BVar26.index] == (Span)0xff) || (*(long *)(BVar26.span + 0x80) == 0))
              goto LAB_005b0a68;
              QPersistentModelIndex::QPersistentModelIndex(&local_70,(QModelIndex *)&local_98);
              pDVar8 = (this->expandedIndexes).q_hash.d;
              bVar24 = true;
              bVar25 = true;
              if (pDVar8 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0
                 ) goto LAB_005b0a6b;
              pNVar15 = QHashPrivate::
                        Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                        findNode<QPersistentModelIndex>(pDVar8,&local_70);
              bVar25 = pNVar15 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
            }
            else {
LAB_005b0a68:
              bVar25 = false;
LAB_005b0a6b:
              bVar24 = bVar25;
              bVar25 = false;
            }
            if (bVar24) {
              QPersistentModelIndex::~QPersistentModelIndex(&local_70);
            }
            if (!bVar25) {
              iVar11 = (iVar19 - uVar22) + iVar18;
              bVar24 = hasVisibleChildren(this,(QModelIndex *)&local_98);
              *(ulong *)&pQVar14->field_0x1c =
                   (*(ulong *)&pQVar14->field_0x1c & 0xfffffffffffffffb) + (ulong)bVar24 * 4;
              goto LAB_005b0bd3;
            }
          }
          if (recursiveExpanding) {
            QPersistentModelIndex::QPersistentModelIndex(&local_c0,(QModelIndex *)&local_98);
            pDVar8 = (this->expandedIndexes).q_hash.d;
            if ((pDVar8 != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0)
               && (pNVar15 = QHashPrivate::
                             Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                             findNode<QPersistentModelIndex>(pDVar8,&local_c0),
                  pNVar15 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0))
            goto LAB_005b0ac0;
            QHash<QPersistentModelIndex,QHashDummyValue>::emplace<QHashDummyValue_const&>
                      ((QHash<QPersistentModelIndex,QHashDummyValue> *)&this->expandedIndexes,
                       &local_c0,(QHashDummyValue *)&local_68);
            bVar24 = (*(byte *)(*(long *)(this_01 + 8) + 0x30) & 2) == 0;
          }
          else {
LAB_005b0ac0:
            bVar24 = false;
          }
          if (recursiveExpanding) {
            QPersistentModelIndex::~QPersistentModelIndex(&local_c0);
          }
          if (bVar24) {
            local_68 = (undefined1 *)0x0;
            pQStack_60 = (QModelIndex *)&local_98;
            QMetaObject::activate(this_01,&QTreeView::staticMetaObject,0,&local_68);
          }
          pQVar14->field_0x1c = pQVar14->field_0x1c | 1;
          layout(this,iVar11,recursiveExpanding,afterIsUninitialized);
          pQVar14 = QList<QTreeViewItem>::data(this_00);
          pQVar14 = pQVar14 + iVar11;
          uVar17 = *(ulong *)&pQVar14->field_0x1c;
          iVar18 = iVar18 + ((uint)(uVar17 >> 4) & 0xfffffff);
          *(ulong *)&pQVar14->field_0x1c =
               (uVar17 & 0xfffffffffffffffb) + (ulong)(0xf < (uint)uVar17) * 4;
          iVar11 = (iVar18 - uVar22) + iVar19;
        }
        else {
          pDVar7 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                     **)(*(long *)((this->super_QAbstractItemViewPrivate).model + 8) + 0x90);
          if (pDVar7 == (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                         *)0x0) {
LAB_005b0881:
            bVar24 = false;
          }
          else {
            BVar26 = QHashPrivate::
                     Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                     ::findBucket<QtPrivate::QModelIndexWrapper>
                               (pDVar7,(QModelIndexWrapper *)&local_68);
            if (BVar26.span[BVar26.index] == (Span)0xff) goto LAB_005b0881;
            bVar24 = *(long *)(BVar26.span + 0x80) != 0;
          }
          if (bVar24) {
            QPersistentModelIndex::QPersistentModelIndex(&local_78,(QModelIndex *)&local_98);
            pDVar8 = (this->hiddenIndexes).q_hash.d;
            if (pDVar8 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0)
            goto LAB_005b08bd;
            pNVar15 = QHashPrivate::
                      Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                      findNode<QPersistentModelIndex>(pDVar8,&local_78);
            bVar25 = pNVar15 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
          }
          else {
LAB_005b08bd:
            bVar25 = false;
          }
          if (bVar24) {
            QPersistentModelIndex::~QPersistentModelIndex(&local_78);
          }
          if (!bVar25) goto LAB_005b08f5;
          iVar11 = ~uVar22 + iVar18 + iVar19;
          uVar22 = uVar22 + 1;
        }
LAB_005b0bd3:
        iVar19 = iVar19 + 1;
        iVar21 = iVar21 + 1;
      } while (iVar19 < iVar12);
      iVar11 = iVar11 + 1;
    }
    if (0 < (int)uVar22) {
      if (afterIsUninitialized == false) {
        removeViewItems(this,iVar11,uVar22);
      }
      else {
        QList<QTreeViewItem>::resize(this_00,(this->viewItems).d.size - (ulong)uVar22);
      }
    }
    if (bVar9 && -1 < i) {
      do {
        pQVar14 = QList<QTreeViewItem>::data(this_00);
        *(ulong *)&pQVar14[uVar20].field_0x1c =
             *(ulong *)&pQVar14[uVar20].field_0x1c & 0xffffffff0000000f |
             (ulong)((int)*(ulong *)&pQVar14[uVar20].field_0x1c + (uVar13 - uVar22) * 0x10 &
                    0xfffffff0);
        pQVar14 = QList<QTreeViewItem>::data(this_00);
        pQVar14 = pQVar14 + uVar20;
        uVar20 = (ulong)(uint)pQVar14->parentItem;
      } while (-1 < pQVar14->parentItem);
    }
    this->pendingAccessibilityUpdate =
         (bool)(this->pendingAccessibilityUpdate | lVar2 != (this->viewItems).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeViewPrivate::layout(int i, bool recursiveExpanding, bool afterIsUninitialized)
{
    Q_Q(QTreeView);
    QModelIndex current;
    QModelIndex parent = (i < 0) ? (QModelIndex)root : modelIndex(i);

    if (i>=0 && !parent.isValid()) {
        //modelIndex() should never return something invalid for the real items.
        //This can happen if columncount has been set to 0.
        //To avoid infinite loop we stop here.
        return;
    }

#if QT_CONFIG(accessibility)
    // QAccessibleTree's rowCount implementation uses viewItems.size(), so
    // we need to invalidate any cached accessibility data structures if
    // that value changes during the run of this function.
    const auto resetModelIfNeeded = qScopeGuard([oldViewItemsSize = viewItems.size(), this]{
        pendingAccessibilityUpdate |= oldViewItemsSize != viewItems.size();
    });
#endif

    int count = 0;
    if (model->hasChildren(parent)) {
        if (model->canFetchMore(parent)) {
            // fetchMore first, otherwise we might not yet have any data for sizeHintForRow
            model->fetchMore(parent);
            // guestimate the number of items in the viewport, and fetch as many as might fit
            const int itemHeight = defaultItemHeight <= 0 ? q->sizeHintForRow(0) : defaultItemHeight;
            const int viewCount = itemHeight ? viewport->height() / itemHeight : 0;
            int lastCount = -1;
            while ((count = model->rowCount(parent)) < viewCount &&
                   count != lastCount && model->canFetchMore(parent)) {
                model->fetchMore(parent);
                lastCount = count;
            }
        } else {
            count = model->rowCount(parent);
        }
    }

    bool expanding = true;
    if (i == -1) {
        if (uniformRowHeights) {
            QModelIndex index = model->index(0, 0, parent);
            defaultItemHeight = q->indexRowSizeHint(index);
        }
        viewItems.resize(count);
        afterIsUninitialized = true;
    } else if (q20::cmp_not_equal(viewItems[i].total, count)) {
        if (!afterIsUninitialized)
            insertViewItems(i + 1, count, QTreeViewItem()); // expand
        else if (count > 0)
            viewItems.resize(viewItems.size() + count);
    } else {
        expanding = false;
    }

    int first = i + 1;
    int level = (i >= 0 ? viewItems.at(i).level + 1 : 0);
    int hidden = 0;
    int last = 0;
    int children = 0;
    QTreeViewItem *item = nullptr;
    for (int j = first; j < first + count; ++j) {
        current = model->index(j - first, 0, parent);
        if (isRowHidden(current)) {
            ++hidden;
            last = j - hidden + children;
        } else {
            last = j - hidden + children;
            if (item)
                item->hasMoreSiblings = true;
            item = &viewItems[last];
            item->index = current;
            item->parentItem = i;
            item->level = level;
            item->height = 0;
            item->spanning = q->isFirstColumnSpanned(current.row(), parent);
            item->expanded = false;
            item->total = 0;
            item->hasMoreSiblings = false;
            if ((recursiveExpanding && !(current.flags() & Qt::ItemNeverHasChildren)) || isIndexExpanded(current)) {
                if (recursiveExpanding && storeExpanded(current) && !q->signalsBlocked())
                    emit q->expanded(current);
                item->expanded = true;
                layout(last, recursiveExpanding, afterIsUninitialized);
                item = &viewItems[last];
                children += item->total;
                item->hasChildren = item->total > 0;
                last = j - hidden + children;
            } else {
                item->hasChildren = hasVisibleChildren(current);
            }
        }
    }

    // remove hidden items
    if (hidden > 0) {
        if (!afterIsUninitialized)
            removeViewItems(last + 1, hidden);
        else
            viewItems.resize(viewItems.size() - hidden);
    }

    if (!expanding)
        return; // nothing changed

    while (i > -1) {
        viewItems[i].total += count - hidden;
        i = viewItems[i].parentItem;
    }
}